

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O2

SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *
Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::New
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *bucket)

{
  undefined4 *puVar1;
  uint objectCount;
  code *pcVar2;
  bool bVar3;
  HeapAllocator *pHVar4;
  size_t sVar5;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *this;
  uint uVar6;
  undefined8 *in_FS_OFFSET;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  uVar6 = (bucket->super_HeapBucket).sizeCat;
  if (0x300 < uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0x1d,"(bucket->sizeCat <= TBlockAttributes::MaxObjectSize)",
                       "bucket->sizeCat <= TBlockAttributes::MaxObjectSize");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    uVar6 = (bucket->super_HeapBucket).sizeCat;
  }
  objectCount = 0x1000 / (uVar6 & 0xffff);
  pHVar4 = HeapAllocator::GetNoMemProtectInstance();
  data.typeinfo =
       (type_info *)SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAllocPlusSize(objectCount);
  local_50 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_18923f;
  data.filename._0_4_ = 0x24;
  pHVar4 = HeapAllocator::TrackAllocInfo(pHVar4,(TrackAllocData *)local_50);
  sVar5 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAllocPlusSize(objectCount);
  this = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
         new<Memory::HeapAllocator>(0x110,pHVar4,true,0x21f624,0,SUB81(sVar5,0));
  SmallNormalWithBarrierHeapBlockT
            (this,&bucket->super_HeapBucket,(ushort)uVar6,(ushort)objectCount,
             SmallNormalBlockWithBarrierType);
  return this;
}

Assistant:

SmallNormalWithBarrierHeapBlockT<TBlockAttributes> *
SmallNormalWithBarrierHeapBlockT<TBlockAttributes>::New(HeapBucketT<SmallNormalWithBarrierHeapBlockT<TBlockAttributes>> * bucket)
{
    CompileAssert(TBlockAttributes::MaxObjectSize <= USHRT_MAX);
    Assert(bucket->sizeCat <= TBlockAttributes::MaxObjectSize);
    Assert((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= USHRT_MAX);

    ushort objectSize = (ushort)bucket->sizeCat;
    ushort objectCount = (ushort)((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / objectSize);

    HeapBlockType blockType = (TBlockAttributes::IsSmallBlock ? HeapBlock::SmallNormalBlockWithBarrierType : HeapBlock::MediumNormalBlockWithBarrierType);
    return NoMemProtectHeapNewNoThrowPlusPrefixZ(Base::GetAllocPlusSize(objectCount), SmallNormalWithBarrierHeapBlockT<TBlockAttributes>, bucket, objectSize, objectCount, blockType);
}